

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoEngine.cpp
# Opt level: O1

bool __thiscall VideoEngine::Framebuffer::attachColorTexture(Framebuffer *this,int i,Texture *tex)

{
  int iVar1;
  
  this->w = tex->w_;
  this->h = tex->h_;
  glFramebufferTexture2D(0x8d40,i + 0x8ce0,0xde1,tex->name_,0);
  GLCHECK(
         "glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + i, GL_TEXTURE_2D, tex.name(), 0)"
         );
  iVar1 = glCheckFramebufferStatus(0x8d40);
  return iVar1 == 0x8cd5;
}

Assistant:

bool VideoEngine::Framebuffer::attachColorTexture(int i, const Texture &tex) {
	// FIXME check?
	w = tex.w();
	h = tex.h();
	GL(glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + i, GL_TEXTURE_2D, tex.name(), 0));

	const int status = glCheckFramebufferStatus(GL_FRAMEBUFFER);
	return status == GL_FRAMEBUFFER_COMPLETE;
}